

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

string * __thiscall
tinyusdz::primvar::PrimVar::type_name_abi_cxx11_(string *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  allocator local_11;
  
  bVar1 = has_value(this);
  if (bVar1) {
    linb::any::type_name_abi_cxx11_(__return_storage_ptr__,(any *)this);
  }
  else if ((this->_ts)._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           (this->_ts)._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"[[InvalidType]]",&local_11);
  }
  else {
    tinyusdz::value::TimeSamples::type_name_abi_cxx11_(__return_storage_ptr__,&this->_ts);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const {
    if (has_default()) {
      return _value.type_name();
    }
      
    if (has_timesamples()) {
      return _ts.type_name();
    }

    return "[[InvalidType]]";
  }